

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O2

void __thiscall embree::Instantiator::~Instantiator(Instantiator *this)

{
  Node *pNVar1;
  HeightField *pHVar2;
  
  (this->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__Instantiator_001c4ec8;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->dist).super___shared_ptr<embree::Distribution2D,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  pNVar1 = (this->object).ptr;
  if (pNVar1 != (Node *)0x0) {
    (*(pNVar1->super_RefCount)._vptr_RefCount[3])();
  }
  pHVar2 = (this->heightField).ptr;
  if (pHVar2 != (HeightField *)0x0) {
    (*(pHVar2->super_RefCount)._vptr_RefCount[3])();
  }
  return;
}

Assistant:

Instantiator(const Ref<HeightField>& heightField,
                 const Ref<SceneGraph::Node>& object, const Ref<Image>& distribution, float minDistance, size_t N)
      : heightField(heightField), object(object), /*minDistance(minDistance),*/ N(N)
    {
      /* create distribution */
      size_t width = distribution->width;
      size_t height = distribution->height;
      std::vector<float> values(width*height);
      for (size_t y=0; y<height; y++)
        for (size_t x=0; x<width; x++)
          values[y*width+x] = luminance(distribution->get(x,y));
      dist = std::make_shared<Distribution2D>(values.data(),width,height);
    }